

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O3

void anon_unknown.dwarf_be6cc::testFloatToHalf(uint floatVal,uint halfVal)

{
  half hVar1;
  ushort uVar2;
  ostream *poVar3;
  long *plVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"floatToHalf (",0xd);
  poVar3 = std::ostream::_M_insert<double>((double)(float)floatVal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") == ",5);
  hVar1._h = Imf_3_4::floatToHalf((float)floatVal);
  plVar4 = (long *)::operator<<(poVar3,hVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  uVar2 = Imf_3_4::floatToHalf((float)floatVal);
  if (uVar2 == halfVal) {
    return;
  }
  __assert_fail("floatToHalf (u.f).bits () == halfVal",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x45,"void (anonymous namespace)::testFloatToHalf(unsigned int, unsigned int)");
}

Assistant:

void
testFloatToHalf (unsigned int floatVal, unsigned int halfVal)
{
    union
    {
        unsigned int ui;
        float        f;
    } u;
    u.ui = floatVal;
    cout << "floatToHalf (" << u.f << ") == " << floatToHalf (u.f) << endl;
    assert (floatToHalf (u.f).bits () == halfVal);
}